

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict new_node(c2m_ctx_t c2m_ctx,node_code_t nc)

{
  uint uVar1;
  node_t_conflict n_00;
  node_t_conflict n;
  node_code_t nc_local;
  c2m_ctx_t c2m_ctx_local;
  
  n_00 = (node_t_conflict)reg_malloc(c2m_ctx,0x30);
  n_00->code = nc;
  uVar1 = c2m_ctx->curr_uid;
  c2m_ctx->curr_uid = uVar1 + 1;
  n_00->uid = uVar1;
  DLIST_node_t_init(&(n_00->u).ops);
  n_00->attr = (void *)0x0;
  set_node_pos(c2m_ctx,n_00,(pos_t)(ZEXT816((ulong)0xffffffffffffffff) << 0x40));
  return n_00;
}

Assistant:

static node_t new_node (c2m_ctx_t c2m_ctx, node_code_t nc) {
  node_t n = reg_malloc (c2m_ctx, sizeof (struct node));

  n->code = nc;
  n->uid = curr_uid++;
  DLIST_INIT (node_t, n->u.ops);
  n->attr = NULL;
  set_node_pos (c2m_ctx, n, no_pos);
  return n;
}